

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyReleased(int user_key_index)

{
  byte local_1a;
  bool local_19;
  ImGuiContext *g;
  int user_key_index_local;
  
  if (user_key_index < 0) {
    g._7_1_ = false;
  }
  else {
    local_19 = 0x1ff < (uint)user_key_index;
    if (local_19) {
      __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1258,"bool ImGui::IsKeyReleased(int)");
    }
    local_1a = 0;
    if (0.0 <= (GImGui->IO).KeysDownDurationPrev[user_key_index]) {
      local_1a = (GImGui->IO).KeysDown[user_key_index] ^ 0xff;
    }
    g._7_1_ = (bool)(local_1a & 1);
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsKeyReleased(int user_key_index)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0) return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    return g.IO.KeysDownDurationPrev[user_key_index] >= 0.0f && !g.IO.KeysDown[user_key_index];
}